

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O1

QDataStream * operator>>(QDataStream *s,QRectF *r)

{
  long in_FS_OFFSET;
  double h;
  double w;
  double y;
  double x;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = -NAN;
  local_48 = -NAN;
  local_50 = -NAN;
  local_58 = -NAN;
  QDataStream::operator>>(s,&local_40);
  QDataStream::operator>>(s,&local_48);
  QDataStream::operator>>(s,&local_50);
  QDataStream::operator>>(s,&local_58);
  r->xp = local_40;
  r->yp = local_48;
  r->w = local_50;
  r->h = local_58;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &s, QRectF &r)
{
    double x, y, w, h;
    s >> x;
    s >> y;
    s >> w;
    s >> h;
    r.setRect(qreal(x), qreal(y), qreal(w), qreal(h));
    return s;
}